

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_convert.cpp
# Opt level: O0

bool Potassco::detail::find_kv(EnumClass *e,StringSpan *sKey,int *iKey,StringSpan *sOut,int *iOut)

{
  int iVar1;
  char *x;
  int *out;
  undefined8 *in_RCX;
  int *in_RDX;
  undefined8 *in_RSI;
  long in_RDI;
  int *in_R8;
  Span<char> SVar2;
  char *v;
  size_t s;
  int cVal;
  char *args;
  undefined1 in_stack_ffffffffffffffa0 [16];
  int local_3c;
  int *local_38;
  
  local_38 = *(int **)(in_RDI + 8);
  local_3c = *(int *)(in_RDI + 0x10);
  while( true ) {
    x = (char *)strcspn((char *)local_38," ,=");
    for (out = (int *)((long)local_38 + (long)x); (char)*out == ' '; out = (int *)((long)out + 1)) {
    }
    if ((char)*out == '=') {
      Potassco::xconvert(x,out,in_stack_ffffffffffffffa0._8_8_,in_stack_ffffffffffffffa0._4_4_);
      for (; (char)*out == ' '; out = (int *)((long)out + 1)) {
      }
    }
    if (((in_RDX != (int *)0x0) && (local_3c == *in_RDX)) ||
       ((in_RSI != (undefined8 *)0x0 &&
        (((char *)in_RSI[1] == x &&
         (iVar1 = strncmp((char *)local_38,(char *)*in_RSI,(size_t)x), iVar1 == 0)))))) break;
    local_38 = out;
    if ((char)*out != ',') {
      return false;
    }
    do {
      local_38 = (int *)((long)local_38 + 1);
    } while (*(char *)local_38 == ' ');
    local_3c = local_3c + 1;
  }
  if (in_R8 != (int *)0x0) {
    *in_R8 = local_3c;
  }
  if (in_RCX != (undefined8 *)0x0) {
    SVar2 = toSpan<char>((char *)local_38,(size_t)x);
    *in_RCX = SVar2.first;
    in_RCX[1] = SVar2.size;
  }
  return true;
}

Assistant:

bool find_kv(const EnumClass& e, const StringSpan* sKey, const int* iKey, StringSpan* sOut, int* iOut) {
#define SKIPWS(x) while (*(x) == ' ')  ++(x)
	const char* args = e.rep;
	for (int cVal = e.min;; ++cVal) {
		std::size_t s = std::strcspn(args, " ,=");
		const char* v = args + s;
		SKIPWS(v);
		if (*v == '=') { xconvert(v+1, cVal, &v, ','); SKIPWS(v); }
		if ((iKey && cVal == *iKey) || (sKey && sKey->size == s && std::strncmp(args, sKey->first, s) == 0)) {
			if (iOut) { *iOut = cVal; }
			if (sOut) { *sOut = toSpan(args, s); }
			return true;
		}
		if (*(args = v)++ != ',') {
			return false;
		}
		SKIPWS(args);
	}
#undef SKIPWS
}